

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void rfft1pt(float *ioptr)

{
  float fVar1;
  float t0i;
  float t0r;
  float f0i;
  float f0r;
  float *ioptr_local;
  
  fVar1 = *ioptr;
  *ioptr = fVar1 + ioptr[1];
  ioptr[1] = fVar1 - ioptr[1];
  return;
}

Assistant:

static inline void rfft1pt(float *ioptr) {
/***   RADIX 2 rfft	***/
float f0r, f0i;
float t0r, t0i;

	/* bit reversed load */
f0r = ioptr[0];
f0i = ioptr[1];

	/* finish rfft */
t0r = 	f0r + f0i;
t0i = 	f0r - f0i;

	/* store result */
ioptr[0] = t0r;
ioptr[1] = t0i;
}